

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMeshType.cpp
# Opt level: O0

ostream * operator<<(ostream *out,MMeshType meshType)

{
  ostream *in_RDI;
  MMeshType in_stack_0000001c;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  MMeshType_Name_abi_cxx11_(in_stack_0000001c);
  std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const MMeshType meshType)
{
    out << MMeshType_Name(meshType);
    return out;
}